

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_ctl.c
# Opt level: O1

void vline_tilde_stop(t_vline *x)

{
  _vseg *p_Var1;
  t_vseg *fatso;
  
  fatso = x->x_list;
  while (fatso != (t_vseg *)0x0) {
    p_Var1 = fatso->s_next;
    freebytes(fatso,0x20);
    fatso = p_Var1;
  }
  x->x_list = (t_vseg *)0x0;
  x->x_inc = 0.0;
  x->x_inlet1 = 0.0;
  x->x_inlet2 = 0.0;
  x->x_target = (float)x->x_value;
  x->x_targettime = 1e+20;
  return;
}

Assistant:

static void vline_tilde_stop(t_vline *x)
{
    t_vseg *s1, *s2;
    for (s1 = x->x_list; s1; s1 = s2)
        s2 = s1->s_next, t_freebytes(s1, sizeof(*s1));
    x->x_list = 0;
    x->x_inc = 0;
    x->x_inlet1 = x->x_inlet2 = 0;
    x->x_target = x->x_value;
    x->x_targettime = 1e20;
}